

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O0

uint32_t __thiscall TcpSocket::Connect(TcpSocket *this)

{
  int iVar1;
  runtime_error *this_00;
  string local_258 [48];
  stringstream local_228 [8];
  stringstream stream;
  ostream local_218 [380];
  socklen_t local_9c;
  undefined1 local_98 [4];
  socklen_t len;
  sockaddr_storage source;
  TcpSocket *this_local;
  
  local_9c = 0x80;
  source.__ss_align = (unsigned_long)this;
  iVar1 = getsockname((this->super_Socket).m_Socket,(sockaddr *)local_98,&local_9c);
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_228);
    std::operator<<(local_218,"Read local tcp/ip address failed");
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_258);
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::stringstream::~stringstream(local_228);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Read local tcp/ip address failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_98._0_2_ == 2) {
    this_local._4_4_ = ntohl(len);
  }
  else if (local_98._0_2_ == 10) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t TcpSocket::Connect() const
{
    struct sockaddr_storage source;
    socklen_t len = sizeof(source);

    if (getsockname(m_Socket, reinterpret_cast<sockaddr*>(&source), &len)) {
        LOG_ERROR("Read local tcp/ip address failed");
        throw std::runtime_error("Read local tcp/ip address failed");
    }

    switch (source.ss_family) {
    case AF_INET:
        return ntohl(reinterpret_cast<sockaddr_in*>(&source)->sin_addr.s_addr);

    case AF_INET6:
        return 0xffffffff;

    default:
        return 0;
    }
}